

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html.cpp
# Opt level: O0

Node * __thiscall crawler::Parser::parseElement(Node *__return_storage_ptr__,Parser *this)

{
  shared_ptr<crawler::Node> local_28;
  Parser *local_18;
  Parser *this_local;
  
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::shared_ptr<crawler::Node>::shared_ptr(&local_28,(nullptr_t)0x0);
  parseElement(__return_storage_ptr__,this,&local_28);
  std::shared_ptr<crawler::Node>::~shared_ptr(&local_28);
  return __return_storage_ptr__;
}

Assistant:

crawler::Node crawler::Parser::parseElement() { return parseElement(nullptr); }